

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O0

int RSA_padding_add_PKCS1_OAEP_mgf1
              (uint8_t *to,size_t to_len,uint8_t *from,size_t from_len,uint8_t *param,
              size_t param_len,EVP_MD *md,EVP_MD *mgf1md)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  uchar *buf;
  uchar *md_00;
  ulong local_c0;
  size_t i_1;
  uint8_t seedmask [64];
  size_t i;
  uchar *puStack_68;
  int ret;
  uint8_t *dbmask;
  uint8_t *db;
  uint8_t *seed;
  size_t emlen;
  size_t mdlen;
  size_t param_len_local;
  uint8_t *param_local;
  size_t from_len_local;
  uint8_t *from_local;
  size_t to_len_local;
  uint8_t *to_local;
  ulong seedlen;
  
  if (md == (EVP_MD *)0x0) {
    md = (EVP_MD *)EVP_sha1();
  }
  if (mgf1md == (EVP_MD *)0x0) {
    mgf1md = md;
  }
  iVar1 = EVP_MD_size((EVP_MD *)md);
  seedlen = CONCAT44(extraout_var,iVar1);
  if (to_len < seedlen * 2 + 2) {
    ERR_put_error(4,0,0x7e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0x3a);
    to_local._4_4_ = 0;
  }
  else {
    uVar3 = to_len - 1;
    if ((uVar3 + seedlen * -2) - 1 < from_len) {
      ERR_put_error(4,0,0x72,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                    ,0x40);
      to_local._4_4_ = 0;
    }
    else if (uVar3 < seedlen * 2 + 1) {
      ERR_put_error(4,0,0x7e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                    ,0x45);
      to_local._4_4_ = 0;
    }
    else {
      *to = '\0';
      buf = to + 1;
      md_00 = to + seedlen + 1;
      puStack_68 = (uchar *)0x0;
      i._4_4_ = 0;
      iVar2 = EVP_Digest(param,param_len,md_00,(uint *)0x0,(EVP_MD *)md,(ENGINE *)0x0);
      if (iVar2 != 0) {
        OPENSSL_memset(md_00 + seedlen,0,((uVar3 - from_len) + seedlen * -2) - 1);
        md_00[((uVar3 - from_len) - seedlen) + -1] = '\x01';
        OPENSSL_memcpy(md_00 + ((uVar3 - from_len) - seedlen),from,from_len);
        iVar1 = RAND_bytes(buf,iVar1);
        if (((iVar1 != 0) &&
            (puStack_68 = (uchar *)OPENSSL_malloc(uVar3 - seedlen), puStack_68 != (uchar *)0x0)) &&
           (iVar1 = PKCS1_MGF1(puStack_68,uVar3 - seedlen,buf,seedlen,(EVP_MD *)mgf1md), iVar1 != 0)
           ) {
          seedmask[0x38] = '\0';
          seedmask[0x39] = '\0';
          seedmask[0x3a] = '\0';
          seedmask[0x3b] = '\0';
          seedmask[0x3c] = '\0';
          seedmask[0x3d] = '\0';
          seedmask[0x3e] = '\0';
          seedmask[0x3f] = '\0';
          for (; (ulong)seedmask._56_8_ < uVar3 - seedlen; seedmask._56_8_ = seedmask._56_8_ + 1) {
            md_00[seedmask._56_8_] = md_00[seedmask._56_8_] ^ puStack_68[seedmask._56_8_];
          }
          iVar1 = PKCS1_MGF1((uchar *)&i_1,seedlen,md_00,uVar3 - seedlen,(EVP_MD *)mgf1md);
          if (iVar1 != 0) {
            for (local_c0 = 0; local_c0 < seedlen; local_c0 = local_c0 + 1) {
              buf[local_c0] = buf[local_c0] ^ seedmask[local_c0 - 8];
            }
            i._4_4_ = 1;
          }
        }
      }
      OPENSSL_free(puStack_68);
      to_local._4_4_ = i._4_4_;
    }
  }
  return to_local._4_4_;
}

Assistant:

int RSA_padding_add_PKCS1_OAEP_mgf1(uint8_t *to, size_t to_len,
                                    const uint8_t *from, size_t from_len,
                                    const uint8_t *param, size_t param_len,
                                    const EVP_MD *md, const EVP_MD *mgf1md) {
  if (md == NULL) {
    md = EVP_sha1();
  }
  if (mgf1md == NULL) {
    mgf1md = md;
  }

  size_t mdlen = EVP_MD_size(md);

  if (to_len < 2 * mdlen + 2) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_KEY_SIZE_TOO_SMALL);
    return 0;
  }

  size_t emlen = to_len - 1;
  if (from_len > emlen - 2 * mdlen - 1) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE_FOR_KEY_SIZE);
    return 0;
  }

  if (emlen < 2 * mdlen + 1) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_KEY_SIZE_TOO_SMALL);
    return 0;
  }

  to[0] = 0;
  uint8_t *seed = to + 1;
  uint8_t *db = to + mdlen + 1;

  uint8_t *dbmask = NULL;
  int ret = 0;
  if (!EVP_Digest(param, param_len, db, NULL, md, NULL)) {
    goto out;
  }
  OPENSSL_memset(db + mdlen, 0, emlen - from_len - 2 * mdlen - 1);
  db[emlen - from_len - mdlen - 1] = 0x01;
  OPENSSL_memcpy(db + emlen - from_len - mdlen, from, from_len);
  if (!RAND_bytes(seed, mdlen)) {
    goto out;
  }

  dbmask = reinterpret_cast<uint8_t *>(OPENSSL_malloc(emlen - mdlen));
  if (dbmask == NULL) {
    goto out;
  }

  if (!PKCS1_MGF1(dbmask, emlen - mdlen, seed, mdlen, mgf1md)) {
    goto out;
  }
  for (size_t i = 0; i < emlen - mdlen; i++) {
    db[i] ^= dbmask[i];
  }

  uint8_t seedmask[EVP_MAX_MD_SIZE];
  if (!PKCS1_MGF1(seedmask, mdlen, db, emlen - mdlen, mgf1md)) {
    goto out;
  }
  for (size_t i = 0; i < mdlen; i++) {
    seed[i] ^= seedmask[i];
  }
  ret = 1;

out:
  OPENSSL_free(dbmask);
  return ret;
}